

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O0

void __thiscall Hpipe::InstructionCond::get_code_repr(InstructionCond *this,ostream *os)

{
  ostream *poVar1;
  ulong uVar2;
  allocator local_59;
  String local_58;
  undefined1 local_38 [8];
  string code;
  ostream *os_local;
  InstructionCond *this_local;
  
  code.field_2._8_8_ = os;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"d",&local_59);
  Cond::ok_cpp((String *)local_38,&this->cond,&local_58,&this->not_in);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  poVar1 = std::operator<<((ostream *)code.field_2._8_8_,"COND ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->off_data);
  poVar1 = std::operator<<(poVar1," ");
  uVar2 = std::__cxx11::string::size();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void InstructionCond::get_code_repr( std::ostream &os ) {
    std::string code = cond.ok_cpp( "d", &not_in );
    os << "COND " << off_data << " " << code.size() << " " << code;
}